

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LZ77.cpp
# Opt level: O3

void __thiscall Lz77Decoder::run(Lz77Decoder *this)

{
  char cVar1;
  int iVar2;
  pointer pcVar3;
  long *plVar4;
  ulong uVar5;
  int *piVar6;
  long lVar7;
  undefined8 uVar8;
  uint uVar9;
  ulong uVar10;
  stringstream offset_s;
  stringstream output;
  stringstream amount_s;
  long *local_550;
  long local_548;
  long local_540 [2];
  int local_52c;
  undefined1 local_528;
  undefined7 uStack_527;
  long local_518 [2];
  ios_base *local_508;
  ios_base *local_500;
  long local_4f8;
  long local_4f0;
  long *local_4e8 [2];
  long local_4d8 [2];
  long *local_4c8;
  ulong local_4c0;
  long local_4b8 [14];
  ios_base aiStack_448 [264];
  stringstream local_340 [16];
  ostream local_330 [112];
  ios_base local_2c0 [264];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base aiStack_138 [264];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"LZ77 decryption...",0x12);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  std::__cxx11::stringstream::stringstream(local_340);
  local_508 = aiStack_138;
  local_500 = aiStack_448;
  uVar9 = 0;
  while( true ) {
    pcVar3 = (this->super_Cryptor).in_message_._M_dataplus._M_p;
    local_4c8 = local_4b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_4c8,pcVar3,
               pcVar3 + (this->super_Cryptor).in_message_._M_string_length);
    uVar5 = local_4c0;
    if (local_4c8 != local_4b8) {
      operator_delete(local_4c8,local_4b8[0] + 1);
    }
    uVar10 = (ulong)uVar9;
    if (uVar5 <= uVar10) {
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=
                ((string *)&(this->super_Cryptor).out_message_,(string *)local_4e8);
      if (local_4e8[0] != local_4d8) {
        operator_delete(local_4e8[0],local_4d8[0] + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"decryption done.",0x10);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
      std::ostream::put(-0x70);
      std::ostream::flush();
      std::__cxx11::stringstream::~stringstream(local_340);
      std::ios_base::~ios_base(local_2c0);
      return;
    }
    pcVar3 = (this->super_Cryptor).in_message_._M_dataplus._M_p;
    local_4c8 = local_4b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_4c8,pcVar3,
               pcVar3 + (this->super_Cryptor).in_message_._M_string_length);
    cVar1 = *(char *)((long)local_4c8 + uVar10);
    if (local_4c8 != local_4b8) {
      operator_delete(local_4c8,local_4b8[0] + 1);
    }
    if (cVar1 == '[') break;
    local_4c8 = local_4b8;
    pcVar3 = (this->super_Cryptor).in_message_._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_4c8,pcVar3,
               pcVar3 + (this->super_Cryptor).in_message_._M_string_length);
    local_1b8[0] = *(stringstream *)((long)local_4c8 + uVar10);
    std::__ostream_insert<char,std::char_traits<char>>(local_330,(char *)local_1b8,1);
    std::ostream::flush();
    if (local_4c8 != local_4b8) {
      operator_delete(local_4c8,local_4b8[0] + 1);
    }
LAB_0010b056:
    uVar9 = uVar9 + 1;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&local_4c8);
  std::__cxx11::stringstream::stringstream(local_1b8);
  uVar9 = uVar9 + 2;
  while( true ) {
    pcVar3 = (this->super_Cryptor).in_message_._M_dataplus._M_p;
    local_550 = local_540;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_550,pcVar3,
               pcVar3 + (this->super_Cryptor).in_message_._M_string_length);
    cVar1 = *(char *)((long)local_550 + (ulong)(uVar9 - 1));
    if (local_550 != local_540) {
      operator_delete(local_550,local_540[0] + 1);
    }
    if (cVar1 == ',') break;
    pcVar3 = (this->super_Cryptor).in_message_._M_dataplus._M_p;
    local_550 = local_540;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_550,pcVar3,
               pcVar3 + (this->super_Cryptor).in_message_._M_string_length);
    local_528 = *(char *)((long)local_550 + (ulong)(uVar9 - 1));
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,&local_528,1);
    std::ostream::flush();
    if (local_550 != local_540) {
      operator_delete(local_550,local_540[0] + 1);
    }
    uVar9 = uVar9 + 1;
  }
  while( true ) {
    pcVar3 = (this->super_Cryptor).in_message_._M_dataplus._M_p;
    local_550 = local_540;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_550,pcVar3,
               pcVar3 + (this->super_Cryptor).in_message_._M_string_length);
    cVar1 = *(char *)((long)local_550 + (ulong)uVar9);
    if (local_550 != local_540) {
      operator_delete(local_550,local_540[0] + 1);
    }
    if (cVar1 == ']') break;
    pcVar3 = (this->super_Cryptor).in_message_._M_dataplus._M_p;
    local_550 = local_540;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_550,pcVar3,
               pcVar3 + (this->super_Cryptor).in_message_._M_string_length);
    local_528 = *(char *)((long)local_550 + (ulong)uVar9);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,&local_528,1);
    std::ostream::flush();
    if (local_550 != local_540) {
      operator_delete(local_550,local_540[0] + 1);
    }
    uVar9 = uVar9 + 1;
  }
  std::__cxx11::stringbuf::str();
  plVar4 = local_550;
  piVar6 = __errno_location();
  iVar2 = *piVar6;
  *piVar6 = 0;
  lVar7 = strtol((char *)plVar4,(char **)&local_528,10);
  if ((long *)CONCAT71(uStack_527,local_528) != plVar4) {
    local_4f0 = lVar7;
    if ((lVar7 - 0x80000000U < 0xffffffff00000000) || (*piVar6 == 0x22)) goto LAB_0010b141;
    if (*piVar6 == 0) {
      *piVar6 = iVar2;
    }
    if (local_550 != local_540) {
      operator_delete(local_550,local_540[0] + 1);
    }
    std::__cxx11::stringbuf::str();
    plVar4 = local_550;
    local_52c = *piVar6;
    *piVar6 = 0;
    lVar7 = strtol((char *)local_550,(char **)&local_528,10);
    if ((long *)CONCAT71(uStack_527,local_528) == plVar4) {
      std::__throw_invalid_argument("stoi");
    }
    else if ((0xfffffffeffffffff < lVar7 - 0x80000000U) && (*piVar6 != 0x22)) {
      if (*piVar6 == 0) {
        *piVar6 = local_52c;
      }
      local_4f8 = lVar7;
      if (local_550 != local_540) {
        operator_delete(local_550,local_540[0] + 1);
      }
      std::__cxx11::stringbuf::str();
      if (local_550 != local_540) {
        operator_delete(local_550,local_540[0] + 1);
      }
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::substr((ulong)&local_550,(ulong)&local_528);
      std::__ostream_insert<char,std::char_traits<char>>(local_330,(char *)local_550,local_548);
      std::ostream::flush();
      if (local_550 != local_540) {
        operator_delete(local_550,local_540[0] + 1);
      }
      if ((long *)CONCAT71(uStack_527,local_528) != local_518) {
        operator_delete((long *)CONCAT71(uStack_527,local_528),local_518[0] + 1);
      }
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base(local_508);
      std::__cxx11::stringstream::~stringstream((stringstream *)&local_4c8);
      std::ios_base::~ios_base(local_500);
      goto LAB_0010b056;
    }
    std::__throw_out_of_range("stoi");
  }
  std::__throw_invalid_argument("stoi");
LAB_0010b141:
  uVar8 = std::__throw_out_of_range("stoi");
  std::__cxx11::stringstream::~stringstream(local_340);
  std::ios_base::~ios_base(local_2c0);
  _Unwind_Resume(uVar8);
}

Assistant:

void Lz77Decoder::run() {
  cout << "LZ77 decryption..." << endl;

  stringstream output;

  for (unsigned int i = 0; i < get_in_message().length(); i++) {
    if (get_in_message()[i] == LEFT_BREAK) {
      i++;

      stringstream offset_s;
      stringstream amount_s;
      while (get_in_message()[i] != SEPARATOR) {
        offset_s << get_in_message()[i] << flush;
        i++;
      }
      i++;
      while (get_in_message()[i] != RIGHT_BREAK) {
        amount_s << get_in_message()[i] << flush;
        i++;
      }

      auto offset = stoi(offset_s.str());
      auto amount = stoi(amount_s.str());
      auto len = static_cast<int>(output.str().length());

      output << output.str().substr(static_cast<unsigned long>(len - offset),
        static_cast<unsigned long>(amount)) << flush;
    }
    else {
      output << get_in_message()[i] << flush;
    }
  }

  set_out_message(output.str());

  cout << "decryption done." << endl;
}